

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

void tcg_gen_dup_mem_vec_arm
               (TCGContext_conflict *tcg_ctx,uint vece,TCGv_vec r,TCGv_ptr b,tcg_target_long ofs)

{
  TCGArg a;
  TCGArg a_00;
  TCGTemp *pTVar1;
  TCGType_conflict type;
  TCGTemp *rt;
  TCGArg bi;
  TCGArg ri;
  tcg_target_long ofs_local;
  TCGv_ptr b_local;
  TCGv_vec r_local;
  uint vece_local;
  TCGContext_conflict *tcg_ctx_local;
  
  a = tcgv_vec_arg(tcg_ctx,r);
  a_00 = tcgv_ptr_arg(tcg_ctx,b);
  pTVar1 = arg_temp(a);
  vec_gen_3_arm(tcg_ctx,INDEX_op_dupm_vec,
                (TCGType_conflict)((ulong)*(undefined8 *)pTVar1 >> 0x10) & 0xff,vece,a,a_00,ofs);
  return;
}

Assistant:

void tcg_gen_dup_mem_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_ptr b,
                         tcg_target_long ofs)
{
    TCGArg ri = tcgv_vec_arg(tcg_ctx, r);
    TCGArg bi = tcgv_ptr_arg(tcg_ctx, b);
    TCGTemp *rt = arg_temp(ri);
    TCGType type = rt->base_type;

    vec_gen_3(tcg_ctx, INDEX_op_dupm_vec, type, vece, ri, bi, ofs);
}